

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void DCCorrection(double *input,double f0,int fs,int fft_size,double *output)

{
  uint uVar1;
  double *yi;
  double *xi;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = (double)fft_size;
  dVar6 = (double)fs;
  iVar4 = (int)((dVar5 * f0) / dVar6);
  uVar1 = iVar4 + 2;
  uVar2 = 0xffffffffffffffff;
  if (-3 < iVar4) {
    uVar2 = (long)(int)uVar1 << 3;
  }
  yi = (double *)operator_new__(uVar2);
  xi = (double *)operator_new__(uVar2);
  if (-2 < iVar4) {
    uVar2 = 1;
    if (1 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    uVar3 = 0;
    do {
      xi[uVar3] = ((double)(int)uVar3 * dVar6) / dVar5;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  interp1Q(f0 - *xi,-dVar6 / dVar5,input,iVar4 + 3,xi,iVar4 + 1U,yi);
  if (-1 < iVar4) {
    uVar2 = 0;
    do {
      output[uVar2] = input[uVar2] + yi[uVar2];
      uVar2 = uVar2 + 1;
    } while (iVar4 + 1U != uVar2);
  }
  operator_delete__(yi);
  operator_delete__(xi);
  return;
}

Assistant:

void DCCorrection(const double *input, double f0, int fs, int fft_size,
    double *output) {
  int upper_limit = 2 + static_cast<int>(f0 * fft_size / fs);
  double *low_frequency_replica = new double[upper_limit];
  double *low_frequency_axis = new double[upper_limit];

  for (int i = 0; i < upper_limit; ++i)
    low_frequency_axis[i] = static_cast<double>(i) * fs / fft_size;

  int upper_limit_replica = upper_limit - 1;
  interp1Q(f0 - low_frequency_axis[0],
      -static_cast<double>(fs) / fft_size, input, upper_limit + 1,
      low_frequency_axis, upper_limit_replica, low_frequency_replica);

  for (int i = 0; i < upper_limit_replica; ++i)
    output[i] = input[i] + low_frequency_replica[i];

  delete[] low_frequency_replica;
  delete[] low_frequency_axis;
}